

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign.cpp
# Opt level: O0

void initFreeSpace(void)

{
  bool bVar1;
  SectionType type_00;
  uint32_t uVar2;
  FreeSpace *pFVar3;
  uint local_28;
  uint32_t bank;
  SectionType type;
  EnumSeqIterator<SectionType> __end1;
  EnumSeqIterator<SectionType> __begin1;
  EnumSeq<SectionType> *__range1;
  
  EnumSeq<SectionType>::EnumSeq((EnumSeq<SectionType> *)&__end1,SECTTYPE_INVALID);
  type = (SectionType)EnumSeq<SectionType>::begin((EnumSeq<SectionType> *)&__end1);
  bank = (uint32_t)EnumSeq<SectionType>::end((EnumSeq<SectionType> *)&__end1);
  while( true ) {
    bVar1 = operator!=((EnumSeqIterator<SectionType> *)&type,(EnumSeqIterator<SectionType> *)&bank);
    if (!bVar1) {
      return;
    }
    type_00 = EnumSeqIterator<SectionType>::operator*((EnumSeqIterator<SectionType> *)&type);
    uVar2 = nbbanks(type_00);
    pFVar3 = (FreeSpace *)malloc((ulong)uVar2 * 0x18);
    memory[type_00] = pFVar3;
    if (memory[type_00] == (FreeSpace *)0x0) break;
    local_28 = 0;
    while( true ) {
      uVar2 = nbbanks(type_00);
      if (uVar2 <= local_28) break;
      pFVar3 = (FreeSpace *)malloc(0x18);
      memory[type_00][local_28].next = pFVar3;
      if (memory[type_00][local_28].next == (FreeSpace *)0x0) {
        err("Failed to init free space for region %d bank %u",(ulong)type_00,(ulong)local_28);
      }
      (memory[type_00][local_28].next)->address = sectionTypeInfo[type_00].startAddr;
      (memory[type_00][local_28].next)->size = sectionTypeInfo[type_00].size;
      (memory[type_00][local_28].next)->next = (FreeSpace *)0x0;
      (memory[type_00][local_28].next)->prev = memory[type_00] + local_28;
      local_28 = local_28 + 1;
    }
    EnumSeqIterator<SectionType>::operator++((EnumSeqIterator<SectionType> *)&type);
  }
  err("Failed to init free space for region %d",(ulong)type_00);
}

Assistant:

static void initFreeSpace(void)
{
	for (enum SectionType type : EnumSeq(SECTTYPE_INVALID)) {
		memory[type] = (struct FreeSpace *)malloc(sizeof(*memory[type]) * nbbanks(type));
		if (!memory[type])
			err("Failed to init free space for region %d", type);

		for (uint32_t bank = 0; bank < nbbanks(type); bank++) {
			memory[type][bank].next =
				(struct FreeSpace *)malloc(sizeof(*memory[type][0].next));
			if (!memory[type][bank].next)
				err("Failed to init free space for region %d bank %" PRIu32,
				    type, bank);
			memory[type][bank].next->address = sectionTypeInfo[type].startAddr;
			memory[type][bank].next->size    = sectionTypeInfo[type].size;
			memory[type][bank].next->next    = NULL;
			memory[type][bank].next->prev    = &memory[type][bank];
		}
	}
}